

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O3

void __thiscall
njoy::ENDFtk::section::Type<40>::LevelBlock::print<std::back_insert_iterator<std::__cxx11::string>>
          (LevelBlock *this,
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,int MAT,int MF,int MT)

{
  undefined8 uVar1;
  undefined8 uVar2;
  pointer pRVar3;
  ReactionBlock *block;
  pointer this_00;
  undefined1 local_60 [48];
  
  local_60._24_8_ = SEXT48(this->izap_);
  local_60._16_8_ = SEXT48(this->lfs_);
  local_60._0_8_ =
       SEXT48((int)((ulong)((long)(this->reactions_).
                                  super__Vector_base<njoy::ENDFtk::section::ReactionBlock,_std::allocator<njoy::ENDFtk::section::ReactionBlock>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->reactions_).
                                 super__Vector_base<njoy::ENDFtk::section::ReactionBlock,_std::allocator<njoy::ENDFtk::section::ReactionBlock>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 6));
  local_60._8_8_ = 0;
  uVar1 = this->qm_;
  uVar2 = this->qi_;
  local_60._40_4_ = (int)uVar1;
  local_60._32_8_ = uVar2;
  local_60._44_4_ = (int)((ulong)uVar1 >> 0x20);
  ControlRecord::print<std::back_insert_iterator<std::__cxx11::string>>
            ((ControlRecord *)local_60,it,MAT,MF,MT);
  pRVar3 = (this->reactions_).
           super__Vector_base<njoy::ENDFtk::section::ReactionBlock,_std::allocator<njoy::ENDFtk::section::ReactionBlock>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->reactions_).
                 super__Vector_base<njoy::ENDFtk::section::ReactionBlock,_std::allocator<njoy::ENDFtk::section::ReactionBlock>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pRVar3; this_00 = this_00 + 1
      ) {
    ReactionBlock::print<std::back_insert_iterator<std::__cxx11::string>>(this_00,it,MAT,MF,MT);
  }
  return;
}

Assistant:

void print( OutputIterator& it, int MAT, int MF, int MT ) const {

  // metadata
  ControlRecord( this->QM(), this->QI(), this->IZAP(), this->LFS(),
                 0, this->NL() ).print( it, MAT, MF, MT );

  for ( const auto& block : this->reactions_ ) {
    block.print( it, MAT, MF, MT );
  }

}